

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getFuture(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,int index)

{
  pthread_mutex_t *__mutex;
  mapped_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fVar1;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> V;
  key_type local_34;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_30
  ;
  
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(&local_30);
  std::
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  __basic_future((__basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,&local_30._M_future);
  __mutex = (pthread_mutex_t *)
            ((map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)CONCAT44(in_register_00000034,index) + 2);
  std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = std::
            map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[]((map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT44(in_register_00000034,index),&local_34);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(this_00,&local_30);
  pthread_mutex_unlock(__mutex);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~promise(&local_30);
  fVar1.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  fVar1.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
         fVar1.
         super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::future<X> getFuture(int index)
    {
        auto V = std::promise<X>();
        auto fut = V.get_future();
        std::lock_guard<std::mutex> lock(promiseLock);
        promiseByInteger[index] = std::move(V);
        return fut;
    }